

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O0

mraa_result_t pwm_enable_replace(mraa_pwm_context dev,int enable)

{
  ssize_t sVar1;
  uchar local_23 [3];
  int local_20;
  int iStack_1c;
  uchar rx_tx_buf [3];
  int pin;
  int enable_local;
  mraa_pwm_context dev_local;
  
  local_20 = dev->pin;
  if ((local_20 < 9) && (-1 < local_20)) {
    if (_fd == -1) {
      dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
    }
    else {
      iStack_1c = enable;
      memset(local_23,0,3);
      if (_fd == -1) {
        dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
      }
      else {
        local_23[0] = regIon[local_20];
        local_23[1] = 0xff;
        sVar1 = write(_fd,local_23,2);
        if (sVar1 == 2) {
          dev_local._4_4_ = MRAA_SUCCESS;
        }
        else {
          dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
        }
      }
    }
  }
  else {
    dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
  }
  return dev_local._4_4_;
}

Assistant:

static mraa_result_t pwm_enable_replace(mraa_pwm_context dev, int enable)
{
	int pin = dev->pin;

	if(9 > pin && 0 <= pin)
	{
		if(_fd != -1)
		{
			unsigned char rx_tx_buf[3] = {0};

			if(_fd == -1)
			{
				return MRAA_ERROR_NO_RESOURCES;
			}

			rx_tx_buf[0] = regIon[pin];
			rx_tx_buf[1] = 0xFF;
			if(write(_fd, &(rx_tx_buf[0]), 2) != 2)
			{
				return MRAA_ERROR_NO_RESOURCES;
			}
		}
		else
		{
			return MRAA_ERROR_NO_RESOURCES;
		}

		return MRAA_SUCCESS;
	}
	return MRAA_ERROR_NO_RESOURCES;
}